

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

bool __thiscall chrono::ChOptimizerHybrid::DoOptimize(ChOptimizerHybrid *this)

{
  ChOptimizerLocal *pCVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ChLog *pCVar5;
  void *__ptr;
  ChOptimizerGenetic *pCVar6;
  ulong uVar7;
  
  pCVar6 = this->genetic_opt;
  (pCVar6->super_ChOptimizer).minimize = (this->super_ChOptimizer).minimize;
  (this->local_opt->super_ChOptimizer).minimize = (this->super_ChOptimizer).minimize;
  (*(pCVar6->super_ChOptimizer)._vptr_ChOptimizer[6])
            (pCVar6,(ulong)(uint)(this->super_ChOptimizer).C_vars);
  (*(this->local_opt->super_ChOptimizer)._vptr_ChOptimizer[6])
            (this->local_opt,(ulong)(uint)(this->super_ChOptimizer).C_vars);
  pCVar6 = this->genetic_opt;
  (pCVar6->super_ChOptimizer).xv = (this->super_ChOptimizer).xv;
  (pCVar6->super_ChOptimizer).xv_sup = (this->super_ChOptimizer).xv_sup;
  (pCVar6->super_ChOptimizer).xv_inf = (this->super_ChOptimizer).xv_inf;
  pCVar1 = this->local_opt;
  (pCVar1->super_ChOptimizer).xv = (this->super_ChOptimizer).xv;
  (pCVar1->super_ChOptimizer).xv_sup = (this->super_ChOptimizer).xv_sup;
  (pCVar1->super_ChOptimizer).xv_inf = (this->super_ChOptimizer).xv_inf;
  (pCVar6->super_ChOptimizer).break_funct = (this->super_ChOptimizer).break_funct;
  (pCVar1->super_ChOptimizer).break_funct = (this->super_ChOptimizer).break_funct;
  (pCVar6->super_ChOptimizer).break_cycles = (this->super_ChOptimizer).break_cycles;
  (pCVar1->super_ChOptimizer).break_cycles = (this->super_ChOptimizer).break_cycles;
  if (this->use_genetic == true) {
    this->current_phase = 1;
    iVar3 = (*(pCVar6->super_ChOptimizer)._vptr_ChOptimizer[0xb])();
    if ((char)iVar3 != '\0') {
      pCVar6 = this->genetic_opt;
      (this->super_ChOptimizer).fx_evaluations = (pCVar6->super_ChOptimizer).fx_evaluations;
      (this->super_ChOptimizer).grad_evaluations = (pCVar6->super_ChOptimizer).grad_evaluations;
      (this->super_ChOptimizer).opt_fx = (pCVar6->super_ChOptimizer).opt_fx;
      goto LAB_007ec037;
    }
    pCVar6 = this->genetic_opt;
LAB_007ec1a1:
    strcpy((this->super_ChOptimizer).err_message,(pCVar6->super_ChOptimizer).err_message);
    bVar2 = false;
  }
  else {
LAB_007ec037:
    if (this->use_local == true) {
      this->current_phase = 2;
      iVar3 = (*(this->local_opt->super_ChOptimizer)._vptr_ChOptimizer[0xb])();
      if ((char)iVar3 == '\0') {
        pCVar6 = (ChOptimizerGenetic *)this->local_opt;
        goto LAB_007ec1a1;
      }
      pCVar6 = this->genetic_opt;
      pCVar1 = this->local_opt;
      (this->super_ChOptimizer).fx_evaluations =
           (pCVar1->super_ChOptimizer).fx_evaluations + (pCVar6->super_ChOptimizer).fx_evaluations;
      (this->super_ChOptimizer).grad_evaluations =
           (pCVar1->super_ChOptimizer).grad_evaluations +
           (pCVar6->super_ChOptimizer).grad_evaluations;
      (this->super_ChOptimizer).opt_fx = (pCVar1->super_ChOptimizer).opt_fx;
    }
    this->current_phase = 0;
    builtin_strncpy((this->super_ChOptimizer).err_message,
                    "Ok, hybrid optimization has been terminated",0x2c);
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar5->super_ChStreamOutAscii,"\n\nHYBRID OPTIMIZATION TERMINATED.");
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar5->super_ChStreamOutAscii,"\nCurrent system variables after optimization:");
    uVar4 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])(this);
    __ptr = calloc((long)(int)uVar4,8);
    if (0 < (int)uVar4) {
      uVar7 = 0;
      do {
        pCVar5 = GetLog();
        ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n   ");
        pCVar5 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar5->super_ChStreamOutAscii,*(double *)((long)__ptr + uVar7 * 8));
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    free(__ptr);
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar5->super_ChStreamOutAscii,"\n with objective fx obtained equal to = ");
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,(this->super_ChOptimizer).opt_fx);
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n\n\n");
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ChOptimizerHybrid::DoOptimize() {
    // set common optimization settings
    genetic_opt->minimize = minimize;
    local_opt->minimize = minimize;
    genetic_opt->SetNumOfVars(C_vars);
    local_opt->SetNumOfVars(C_vars);
    genetic_opt->SetXv(xv);
    genetic_opt->SetXv_sup(xv_sup);
    genetic_opt->SetXv_inf(xv_inf);
    local_opt->SetXv(xv);
    local_opt->SetXv_sup(xv_sup);
    local_opt->SetXv_inf(xv_inf);

    genetic_opt->break_funct = break_funct;
    local_opt->break_funct = break_funct;
    genetic_opt->break_cycles = break_cycles;
    local_opt->break_cycles = break_cycles;

    // 1)  optimization with genetic method

    if (use_genetic) {
        current_phase = 1;

        if (!genetic_opt->Optimize()) {
            strcpy(err_message, genetic_opt->err_message);
            return false;
        }

        fx_evaluations = genetic_opt->fx_evaluations;
        grad_evaluations = genetic_opt->grad_evaluations;
        opt_fx = genetic_opt->opt_fx;
    }

    // 2)  optimization with gradient method

    if (use_local) {
        current_phase = 2;

        if (!local_opt->Optimize()) {
            strcpy(err_message, local_opt->err_message);
            return false;
        }

        fx_evaluations = genetic_opt->fx_evaluations + local_opt->fx_evaluations;
        grad_evaluations = genetic_opt->grad_evaluations + local_opt->grad_evaluations;
        opt_fx = local_opt->opt_fx;
    }

    current_phase = 0;

    // set class values after optimization
    strcpy(err_message, "Ok, hybrid optimization has been terminated");

    // on termination, reset the system at the value of the fenotypes of the best indiv.
    GetLog() << "\n\nHYBRID OPTIMIZATION TERMINATED.";
    GetLog() << "\nCurrent system variables after optimization:";
    int nv = GetNumOfVars();
    double* myvars = (double*)calloc(nv, sizeof(double));
    // System_to_Vars(myvars);
    for (int mvar = 0; mvar < nv; mvar++) {
        GetLog() << "\n   ";
        GetLog() << myvars[mvar];
    }
    free(myvars);  // delete the array of variables

    GetLog() << "\n with objective fx obtained equal to = ";
    GetLog() << opt_fx;
    GetLog() << "\n\n\n";

    return true;
}